

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<int,_int>::applytype(ostream *os,char type)

{
  undefined4 uVar1;
  long lVar2;
  runtime_error *this;
  uint uVar3;
  undefined7 in_register_00000031;
  
  uVar1 = (undefined4)CONCAT71(in_register_00000031,type);
  switch(uVar1) {
  case 0x58:
  case 0x78:
    lVar2 = *(long *)(*(long *)os + -0x18);
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 8;
    break;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0010b650_caseD_59:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unknown format char");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x61:
    goto switchD_0010b650_caseD_61;
  case 0x62:
  case 0x70:
    goto switchD_0010b650_caseD_62;
  case 99:
  case 100:
  case 0x69:
  case 0x73:
  case 0x75:
    lVar2 = *(long *)(*(long *)os + -0x18);
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 2;
    break;
  case 0x65:
switchD_0010b650_caseD_65:
    lVar2 = *(long *)(*(long *)os + -0x18);
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xfffffefb | 0x100;
    break;
  case 0x66:
switchD_0010b650_caseD_66:
    lVar2 = *(long *)(*(long *)os + -0x18);
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xfffffefb | 4;
    break;
  case 0x67:
switchD_0010b650_caseD_67:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xfffffefb;
    goto switchD_0010b650_caseD_62;
  case 0x6f:
    lVar2 = *(long *)(*(long *)os + -0x18);
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 0x40;
    break;
  default:
    switch(uVar1) {
    case 0x41:
      goto switchD_0010b650_caseD_61;
    default:
      goto switchD_0010b650_caseD_59;
    case 0x45:
      goto switchD_0010b650_caseD_65;
    case 0x46:
      goto switchD_0010b650_caseD_66;
    case 0x47:
      goto switchD_0010b650_caseD_67;
    }
  }
  *(uint *)(os + lVar2 + 0x18) = uVar3;
switchD_0010b650_caseD_62:
  lVar2 = *(long *)(*(long *)os + -0x18);
  if ((byte)(type + 0xbfU) < 0x1a) {
    uVar3 = *(uint *)(os + lVar2 + 0x18) | 0x4000;
  }
  else {
    uVar3 = *(uint *)(os + lVar2 + 0x18) & 0xffffbfff;
  }
  *(uint *)(os + lVar2 + 0x18) = uVar3;
  return;
switchD_0010b650_caseD_61:
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x104;
  goto switchD_0010b650_caseD_62;
}

Assistant:

static void applytype(std::ostream& os, char type)
    {
        // unused type/size chars: b k m n r v w y
        switch(type)
        {
            case 'b': // 'b' for Hex::dumper
                // '-':  only hex, otherwise: hex + ascii
                // '0':  no spaces
                break;
            case 'i':
            case 'd':
            case 'u': // unsigned is part of type
                os << std::dec;
                break;
            case 'o':
                os << std::oct;
                break;
            case 'x':
            case 'X':
                os << std::hex;
                break;
            case 'f': // 123.45
            case 'F':
                os << std::fixed;
                break;
            case 'g':  // shortest of 123.45 and 1.23e+2
            case 'G':
                os.unsetf(os.floatfield);
//                os << std::defaultfloat;
                break;
            case 'a':  // hexadecimal floats
            case 'A':
                os.setf(os.fixed | os.scientific, os.floatfield);
//                os << std::hexfloat;
                break;
            case 'e': // 1.23e+2
            case 'E':
                os << std::scientific;
                break;
            case 'c': // char -> need explicit cast
            case 's': // string - from type
                // reset to decimal
                os << std::dec;
                break;
            case 'p': // pointer value - cast to (void*)
                break;
            default:
                throw std::runtime_error("unknown format char");
        }
        if ('A'<=type && type<='Z')
                os << std::uppercase;
        else
                os << std::nouppercase;
    }